

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::JsRTCallFunctionAction_ProcessArgs
               (EventLogEntry *evt,int32 rootDepth,int64 callEventTime,Var funcVar,uint32 argc,
               Var *argv,int64 topLevelCallbackEventTime,UnlinkableSlabAllocator *alloc)

{
  void **ppvVar1;
  
  if (evt->EventKind == CallExistingFunctionActionTag) {
    *(int32 *)&evt[1].EventTimeStamp = rootDepth;
    *(uint32 *)((long)&evt[1].EventTimeStamp + 4) = argc + 1;
    ppvVar1 = SlabAllocatorBase<8>::SlabAllocateArray<void*>(alloc,(ulong)(argc + 1));
    *(void ***)(evt + 2) = ppvVar1;
    *ppvVar1 = funcVar;
    js_memcpy_s((void *)(*(long *)(evt + 2) + 8),
                (ulong)(*(int *)((long)&evt[1].EventTimeStamp + 4) - 1) << 3,argv,(ulong)argc << 3);
    evt[2].EventTimeStamp = callEventTime;
    evt[3].EventKind = (undefined4)topLevelCallbackEventTime;
    evt[3].ResultStatus = topLevelCallbackEventTime._4_4_;
    evt[3].EventTimeStamp = 0;
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void JsRTCallFunctionAction_ProcessArgs(EventLogEntry* evt, int32 rootDepth, int64 callEventTime, Js::Var funcVar, uint32 argc, Js::Var* argv, int64 topLevelCallbackEventTime, UnlinkableSlabAllocator& alloc)
        {
            JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);

            cfAction->CallbackDepth = rootDepth;
            cfAction->ArgCount = argc + 1;

            static_assert(sizeof(TTDVar) == sizeof(Js::Var), "These need to be the same size (and have same bit layout) for this to work!");

            cfAction->ArgArray = alloc.SlabAllocateArray<TTDVar>(cfAction->ArgCount);
            cfAction->ArgArray[0] = TTD_CONVERT_JSVAR_TO_TTDVAR(funcVar);
            js_memcpy_s(cfAction->ArgArray + 1, (cfAction->ArgCount -1) * sizeof(TTDVar), argv, argc * sizeof(Js::Var));

            cfAction->CallEventTime = callEventTime;

            cfAction->TopLevelCallbackEventTime = topLevelCallbackEventTime;

            cfAction->AdditionalReplayInfo = nullptr;

            //Result is initialized when we register this with the popper
        }